

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O1

void gen_field_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  ushort uVar1;
  uint16_t uVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  char *pcVar21;
  byte bVar22;
  uint uVar23;
  fb_output_t *out_00;
  char cVar24;
  int iVar25;
  fb_output_t *pfVar26;
  bool bVar27;
  bool bVar28;
  char cVar29;
  bool bVar30;
  bool bVar31;
  fb_scoped_name_t snref;
  fb_symbol_text_t scope_name;
  ulong local_2d0;
  fb_scoped_name_t local_1f0;
  char local_108 [216];
  
  bVar22 = 0;
  println(out,"buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);",n);
  println(out,"if (mark != buf) {");
  out->indent = out->indent + 1;
  memset(&local_1f0,0,0xe8);
  __flatcc_fb_copy_scope(ct->scope,local_108);
  uVar1 = *(ushort *)((long)data + 0x28);
  if (uVar1 < 0x11) {
    uVar23 = 0;
    if ((0x10500U >> (uVar1 & 0x1f) & 1) != 0) {
      uVar23 = 1;
      bVar22 = 1;
    }
  }
  else {
    uVar23 = 0;
  }
  uVar2 = (ct->symbol).kind;
  bVar12 = true;
  switch(uVar1) {
  case 8:
    cVar29 = *(long *)((long)data + 0x90) != 0;
    iVar25 = *(int *)((long)data + 0x18);
    bVar15 = (byte)((ushort)*(undefined2 *)((long)data + 0x70) >> 8);
    bVar14 = bVar15 >> 2 & 1;
    bVar15 = bVar15 >> 3 & 1;
    goto LAB_00114e62;
  case 9:
    iVar25 = *(int *)((long)data + 0x18);
    bVar14 = 0;
    bVar15 = 0;
    cVar29 = false;
LAB_00114e62:
    bVar13 = false;
    bVar19 = false;
    bVar27 = false;
    bVar28 = false;
    bVar7 = true;
    bVar10 = false;
    local_2d0 = 0;
    break;
  case 10:
  case 0xb:
    bVar12 = false;
    bVar13 = true;
    goto LAB_00114ec8;
  default:
    bVar13 = false;
LAB_00114ec8:
    bVar7 = false;
    bVar28 = false;
    bVar27 = false;
    bVar19 = false;
    bVar14 = 0;
    bVar15 = 0;
    cVar29 = false;
    bVar10 = false;
    local_2d0 = 0;
    iVar25 = 0;
    break;
  case 0xf:
  case 0x10:
  case 0x14:
    __flatcc_fb_scoped_symbol_name
              ((fb_scope_t *)(*(fb_symbol_t **)((long)data + 0x18))[1].link,
               *(fb_symbol_t **)((long)data + 0x18),&local_1f0);
    sVar3 = *(short *)(*(long *)((long)data + 0x18) + 0x10);
    bVar27 = sVar3 == 1;
    bVar28 = sVar3 == 0;
    bVar19 = hint == 0 && sVar3 == 4;
    if (sVar3 != 3) {
      iVar25 = 0;
    }
    else {
      iVar25 = *(int *)(*(long *)((long)data + 0x18) + 0x50);
    }
    bVar12 = true;
    bVar13 = false;
    bVar15 = 0;
    local_2d0 = 0;
    cVar29 = false;
    bVar14 = 0;
    bVar10 = false;
    bVar7 = sVar3 == 3;
    break;
  case 0x11:
    iVar25 = *(int *)((long)data + 0x18);
    local_2d0 = (ulong)*(uint *)((long)data + 0x2c);
    bVar13 = false;
    bVar7 = true;
    bVar28 = false;
    bVar27 = false;
    bVar19 = false;
    bVar14 = 0;
    bVar15 = 0;
    cVar29 = false;
    bVar10 = true;
  }
  if (*(short *)((long)data + 0x28) == 0x14) {
    if (uVar2 != 1) {
      __assert_fail("is_struct_container",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x1df,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    local_2d0 = (ulong)*(uint *)((long)data + 0x2c);
    bVar10 = true;
  }
  if (bVar14 != 0 || bVar15 != 0) {
    uVar23 = 0;
    bVar7 = false;
    cVar29 = false;
    if (!(bool)(bVar22 & iVar25 == 4)) {
      gen_field_match_cold_1();
      goto LAB_00115df6;
    }
  }
  bVar30 = hint == 0;
  if (!bVar30) {
    bVar7 = false;
  }
  out_00 = (fb_output_t *)(ulong)uVar23;
  if (!bVar30) {
    out_00 = (fb_output_t *)0x0;
  }
  pfVar26 = out_00;
  if (bVar19) {
    pfVar26 = (fb_output_t *)0x0;
  }
  bVar20 = (bool)(iVar25 == 0xc & bVar10 & bVar7);
  if (bVar20) {
    bVar7 = false;
    bVar10 = false;
  }
  if ((bool)cVar29 != false) {
    println(out,"if (buf != end && *buf == \'[\') { /* begin nested */");
    out->indent = out->indent + 1;
  }
  bVar22 = (byte)out_00;
  uVar16 = iVar25 - 1;
  do {
    cVar24 = cVar29;
    if (cVar24 == '\x02') {
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x202,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      pfVar26 = (fb_output_t *)0x0;
      println(out,"} else { /* nested */");
      out->indent = out->indent + 1;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)(*(fb_symbol_t **)((long)data + 0x90))[1].link,
                 *(fb_symbol_t **)((long)data + 0x90),&local_1f0);
      bVar7 = true;
      if (*(short *)(*(long *)((long)data + 0x90) + 0x10) == 0) {
        bVar28 = true;
        bVar7 = bVar27;
      }
      bVar27 = bVar7;
      out_00 = out;
      println(out,"if (flatcc_builder_start_buffer(ctx->ctx, 0, 0, 0)) goto failed;");
      bVar7 = false;
    }
    bVar9 = !bVar7;
    bVar8 = hint == 0;
    bVar11 = !bVar27;
    bVar31 = (bVar9 && bVar8) && bVar11;
    if (bVar7) {
      if (0xb < uVar16) {
        gen_field_match_cold_2();
        goto LAB_00115c64;
      }
      if (uVar16 < 0xc) {
        (*(code *)(&DAT_00141914 + *(int *)(&DAT_00141914 + (ulong)uVar16 * 4)))();
        return;
      }
      gen_field_match_cold_3();
      gen_field_match_cold_4();
      gen_field_match_cold_6();
      gen_field_match_cold_5();
      gen_field_match_cold_7();
      goto LAB_00115db3;
    }
    iVar25 = (int)pfVar26;
    if (iVar25 != 0) {
      if ((bVar9 && bVar8) && bVar11) {
        out_00 = out;
        println(out,"if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;");
      }
      else {
        lVar5 = *(long *)((long)data + 0x80);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = lVar5 + (ulong)(lVar5 == 0);
        out_00 = out;
        println(out,
                "if (flatcc_builder_start_vector(ctx->ctx, %lu, %hu, UINT64_C(%lu))) goto failed;",
                lVar5,(ulong)(uint)(int)*(short *)((long)data + 0x72),
                SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar6,0));
      }
    }
    if (bVar10) {
      println(out,"size_t count = %d;",local_2d0);
      out_00 = out;
      println(out,"void *base = (void *)((size_t)struct_base + %lu);",
              *(undefined8 *)((long)data + 0x78));
    }
    if (bVar20) {
      println(out,"char *base = (char *)((size_t)struct_base + %lu);",
              *(undefined8 *)((long)data + 0x78));
      out_00 = out;
      println(out,"buf = flatcc_json_parser_char_array(ctx, buf, end, base, %d);",local_2d0);
    }
    if (iVar25 != 0 || bVar10) {
      println(out,"buf = flatcc_json_parser_array_start(ctx, buf, end, &more);");
      out_00 = out;
      println(out,"while (more) {");
      out->indent = out->indent + 1;
    }
    if (iVar25 != 0 && ((!bVar9 || !bVar8) || !bVar11)) {
      out_00 = out;
      println(out,"if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;");
    }
    if (uVar2 == 1) {
      if (!bVar20 && !bVar10) {
        out_00 = out;
        println(out,"pval = (void *)((size_t)struct_base + %lu);",*(undefined8 *)((long)data + 0x78)
               );
      }
    }
    else if ((iVar25 == 0) && (bVar27)) {
      out_00 = out;
      println(out,"if (!(pval = flatcc_builder_table_add(ctx->ctx, %lu, %lu, %u))) goto failed;",
              *(undefined8 *)((long)data + 0x88),*(undefined8 *)((long)data + 0x80),
              (ulong)*(ushort *)((long)data + 0x72));
    }
    if (bVar27) {
      if (!bVar10) {
        pcVar21 = "buf = %s_parse_json_struct_inline(ctx, buf, end, pval);";
LAB_001155f9:
        out_00 = out;
        println(out,pcVar21,&local_1f0);
        goto LAB_00115864;
      }
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"buf = %s_parse_json_struct_inline(ctx, buf, end, base);",&local_1f0);
      println(out,"--count;");
      println(out,"base = (void *)((size_t)base + %lu);",
              *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x27f,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"} else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x281,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      pcVar21 = "}";
LAB_0011585d:
      out_00 = out;
      println(out,pcVar21);
    }
    else {
      if (!bVar12) {
        pcVar21 = "buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);";
        goto LAB_0011585d;
      }
      if (bVar14 != 0 || bVar15 != 0) {
        out_00 = out;
        println(out,"buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, %u);",
                (ulong)(bVar14 ^ 1));
        goto LAB_00115864;
      }
      if (bVar28) {
        pcVar21 = "buf = %s_parse_json_table(ctx, buf, end, &ref);";
        goto LAB_001155f9;
      }
      if (bVar19 == false) {
        if (hint == 0) {
          if (iVar25 == 0 && !bVar20) {
            gen_field_match_cold_8();
            println(out_00,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
            return;
          }
        }
        else {
          println(out,"static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {");
          out->indent = out->indent + 2;
          println(out,"%s_parse_json_enum,",&local_1f0);
          println(out,"%s_local_%sjson_parser_enum,",out->S->basename,local_108);
          println(out,"%s_global_json_parser_enum, 0 };",out->S->basename);
          iVar4 = out->indent;
          if ((iVar4 == 0) || (out->indent = iVar4 + -1, iVar4 + -1 == 0)) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x29a,
                          "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                         );
          }
          out->indent = iVar4 + -2;
          uVar17 = *(undefined8 *)((long)data + 0x88);
          uVar18 = *(undefined8 *)((long)data + 0xa0);
          if (bVar30 || uVar23 == 0) {
            pcVar21 = 
            "buf = flatcc_json_parser_union_type(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union);"
            ;
            goto LAB_00115af7;
          }
          out_00 = out;
          println(out,
                  "buf = flatcc_json_parser_union_type_vector(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union, %s_json_union_accept_type);"
                  ,uVar18,uVar17,&local_1f0,&local_1f0);
        }
      }
      else {
        uVar17 = *(undefined8 *)((long)data + 0x88);
        uVar18 = *(undefined8 *)((long)data + 0xa0);
        if ((bVar19 & bVar22) == 0) {
          pcVar21 = 
          "buf = flatcc_json_parser_union(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);";
        }
        else {
          pcVar21 = 
          "buf = flatcc_json_parser_union_vector(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);"
          ;
        }
LAB_00115af7:
        out_00 = out;
        println(out,pcVar21,uVar18,uVar17,&local_1f0);
      }
    }
LAB_00115864:
    if (iVar25 != 0) {
      if (bVar31) {
        println(out,
                "if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;"
               );
        println(out,"*pref = ref;");
      }
      println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
      if (out->indent == 0) {
LAB_00115c64:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2ae,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      pcVar21 = "ref = flatcc_builder_end_vector(ctx->ctx);";
      if (bVar31) {
        pcVar21 = "ref = flatcc_builder_end_offset_vector(ctx->ctx);";
      }
      out_00 = out;
      println(out,pcVar21);
    }
    if (bVar10) {
      println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2b7,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,699,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      println(out,"memset(base, 0, count * %lu);",
              *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2c1,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      out_00 = out;
      println(out,"}");
    }
    cVar29 = '\x02';
  } while (cVar24 == '\x01');
  if (cVar24 == '\x02') {
    println(out,"if (!ref) goto failed;");
    println(out,"ref = flatcc_builder_end_buffer(ctx->ctx, ref);");
    if (out->indent == 0) {
LAB_00115df6:
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x2ca,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    out->indent = out->indent + -1;
    println(out,"} /* end nested */");
  }
  if (((bVar13 || bVar14 != 0) || bVar15 != 0) || ((iVar25 != 0 || cVar24 != '\0') || bVar28)) {
    println(out,"if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, %lu))) goto failed;"
            ,*(undefined8 *)((long)data + 0x88));
    println(out,"*pref = ref;");
  }
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"} else {");
    out->indent = out->indent + 1;
    return;
  }
LAB_00115db3:
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x2d8,"void gen_field_match(fb_output_t *, fb_compound_type_t *, void *, int, int)"
               );
}

Assistant:

static void gen_field_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);", n);
    println(out, "if (mark != buf) {"); indent();
    gen_field_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}